

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::mid(QString *__return_storage_ptr__,QString *this,qsizetype position,qsizetype n)

{
  CutResult CVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  qsizetype local_28;
  qsizetype local_20;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_28 = n;
  local_20 = position;
  CVar1 = QtPrivate::QContainerImplHelper::mid((this->d).size,&local_20,&local_28);
  pQVar2 = (QString *)(*(code *)(&DAT_00148f60 + *(int *)(&DAT_00148f60 + (ulong)CVar1 * 4)))();
  return pQVar2;
}

Assistant:

QString QString::mid(qsizetype position, qsizetype n) const &
{
    qsizetype p = position;
    qsizetype l = n;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(size(), &p, &l)) {
    case QContainerImplHelper::Null:
        return QString();
    case QContainerImplHelper::Empty:
        return QString(DataPointer::fromRawData(&_empty, 0));
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        return sliced(p, l);
    }
    Q_UNREACHABLE_RETURN(QString());
}